

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

_Bool upb_Arena_Fuse(upb_Arena *a1,upb_Arena *a2)

{
  uintptr_t *puVar1;
  upb_ArenaRoot uVar2;
  upb_ArenaInternal *puVar3;
  upb_ArenaInternal *puVar4;
  uintptr_t uVar5;
  upb_ArenaInternal *puVar6;
  _Bool _Var7;
  long lVar8;
  ulong uVar9;
  upb_ArenaInternal *puVar10;
  bool bVar11;
  upb_ArenaRoot uVar12;
  upb_ArenaRoot uVar13;
  
  _Var7 = true;
  if (a1 != a2) {
    if ((((ulong)a1[1].ptr_dont_copy_me__upb_internal_use_only & 1) == 0) &&
       (((ulong)a2[1].ptr_dont_copy_me__upb_internal_use_only & 1) == 0)) {
      lVar8 = 0;
LAB_0011c7c5:
      do {
        uVar12 = _upb_Arena_FindRoot(a1);
        puVar3 = uVar12.root;
        uVar13 = _upb_Arena_FindRoot(a2);
        if (puVar3 == uVar13.root) {
          if (puVar3 == (upb_ArenaInternal *)0x0) goto LAB_0011c7c5;
        }
        else {
          uVar2 = uVar13;
          if (uVar13.root < puVar3) {
            uVar2 = uVar12;
            uVar12 = uVar13;
          }
          uVar5 = uVar12.tagged_count;
          puVar3 = uVar12.root;
          uVar9 = uVar2.tagged_count;
          LOCK();
          bVar11 = uVar5 == puVar3->parent_or_count;
          if (bVar11) {
            puVar3->parent_or_count = uVar5 + (uVar9 & 0xfffffffffffffffe);
          }
          UNLOCK();
          if (!bVar11) goto LAB_0011c7c5;
          if (((undefined1  [16])uVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            __assert_fail("_upb_Arena_IsTaggedPointer(parent_or_count)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/arena.c"
                          ,0x6e,"uintptr_t _upb_Arena_TaggedFromPointer(upb_ArenaInternal *)");
          }
          puVar1 = &(uVar2.root)->parent_or_count;
          LOCK();
          bVar11 = uVar9 == *puVar1;
          if (bVar11) {
            *puVar1 = (uintptr_t)puVar3;
          }
          UNLOCK();
          if (!bVar11) {
            lVar8 = lVar8 + (uVar9 & 0xfffffffffffffffe);
            goto LAB_0011c7c5;
          }
          puVar4 = puVar3->tail;
          puVar10 = uVar2.root;
          do {
            for (puVar6 = puVar4->next; puVar6 != (upb_ArenaInternal *)0x0; puVar6 = puVar6->next) {
              puVar4 = puVar6;
            }
            LOCK();
            puVar6 = puVar4->next;
            puVar4->next = puVar10;
            UNLOCK();
            puVar4 = puVar10->tail;
            puVar10 = puVar6;
          } while (puVar6 != (upb_ArenaInternal *)0x0);
          puVar3->tail = puVar4;
        }
        if (lVar8 == 0) {
          return true;
        }
        uVar9 = puVar3->parent_or_count;
        if ((uVar9 & 1) == 0) goto LAB_0011c7c5;
        LOCK();
        bVar11 = uVar9 == puVar3->parent_or_count;
        if (bVar11) {
          puVar3->parent_or_count = uVar9 - lVar8;
        }
        UNLOCK();
      } while (!bVar11);
    }
    else {
      _Var7 = false;
    }
  }
  return _Var7;
}

Assistant:

bool upb_Arena_Fuse(upb_Arena* a1, upb_Arena* a2) {
  if (a1 == a2) return true;  // trivial fuse

#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogFuse(a1, a2);
#endif

  upb_ArenaInternal* ai1 = upb_Arena_Internal(a1);
  upb_ArenaInternal* ai2 = upb_Arena_Internal(a2);

  // Do not fuse initial blocks since we cannot lifetime extend them.
  // Any other fuse scenario is allowed.
  if (_upb_ArenaInternal_HasInitialBlock(ai1) ||
      _upb_ArenaInternal_HasInitialBlock(ai2)) {
    return false;
  }

  // The number of refs we ultimately need to transfer to the new root.
  uintptr_t ref_delta = 0;
  while (true) {
    upb_ArenaInternal* new_root = _upb_Arena_DoFuse(a1, a2, &ref_delta);
    if (new_root != NULL && _upb_Arena_FixupRefs(new_root, ref_delta)) {
      return true;
    }
  }
}